

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printing.h
# Opt level: O0

ostream * doIndent(ostream *o,uint indent)

{
  ostream *poVar1;
  allocator<char> local_39;
  string local_38 [36];
  uint local_14;
  ostream *poStack_10;
  uint indent_local;
  ostream *o_local;
  
  local_14 = indent;
  poStack_10 = o;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,(ulong)indent,' ',&local_39);
  poVar1 = std::operator<<(o,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return poVar1;
}

Assistant:

inline std::ostream& doIndent(std::ostream& o, unsigned indent) {
  return o << std::string(indent, ' ');
}